

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeInteger(Parse *pParse,Expr *pExpr,int negFlag,int iMem)

{
  Vdbe *p;
  char *z;
  int iVar1;
  char *pcVar2;
  u8 *in_R9;
  int in_stack_ffffffffffffffc8;
  i64 value;
  
  p = pParse->pVdbe;
  if ((pExpr->flags & 0x400) != 0) {
    iVar1 = -(pExpr->u).iValue;
    if (negFlag == 0) {
      iVar1 = (pExpr->u).iValue;
    }
    sqlite3VdbeAddOp2(p,0x46,iVar1,iMem);
    return;
  }
  z = (pExpr->u).zToken;
  iVar1 = sqlite3DecOrHexToI64(z,&value);
  if ((iVar1 != 2) && (iVar1 != 3 || negFlag != 0)) {
    if ((negFlag != 0) && (value = -value, iVar1 == 3)) {
      value = -0x8000000000000000;
    }
    sqlite3VdbeAddOp4Dup8(p,0x47,iMem,(int)&value,-0xe,in_R9,in_stack_ffffffffffffffc8);
    return;
  }
  iVar1 = sqlite3_strnicmp(z,"0x",2);
  if (iVar1 != 0) {
    codeReal(p,z,negFlag,iMem);
    return;
  }
  pcVar2 = "";
  if (negFlag != 0) {
    pcVar2 = "-";
  }
  sqlite3ErrorMsg(pParse,"hex literal too big: %s%s",pcVar2,z);
  return;
}

Assistant:

static void codeInteger(Parse *pParse, Expr *pExpr, int negFlag, int iMem){
  Vdbe *v = pParse->pVdbe;
  if( pExpr->flags & EP_IntValue ){
    int i = pExpr->u.iValue;
    assert( i>=0 );
    if( negFlag ) i = -i;
    sqlite3VdbeAddOp2(v, OP_Integer, i, iMem);
  }else{
    int c;
    i64 value;
    const char *z = pExpr->u.zToken;
    assert( z!=0 );
    c = sqlite3DecOrHexToI64(z, &value);
    if( (c==3 && !negFlag) || (c==2) || (negFlag && value==SMALLEST_INT64)){
#ifdef SQLITE_OMIT_FLOATING_POINT
      sqlite3ErrorMsg(pParse, "oversized integer: %s%s", negFlag ? "-" : "", z);
#else
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( sqlite3_strnicmp(z,"0x",2)==0 ){
        sqlite3ErrorMsg(pParse, "hex literal too big: %s%s", negFlag?"-":"",z);
      }else
#endif
      {
        codeReal(v, z, negFlag, iMem);
      }
#endif
    }else{
      if( negFlag ){ value = c==3 ? SMALLEST_INT64 : -value; }
      sqlite3VdbeAddOp4Dup8(v, OP_Int64, 0, iMem, 0, (u8*)&value, P4_INT64);
    }
  }
}